

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

bool __thiscall pobr::imgProcessing::structs::Segment::isLetterT(Segment *this)

{
  double dVar1;
  uint8_t local_81 [9];
  double hu7;
  double local_70;
  double hu6;
  double local_60;
  double hu5;
  double local_50;
  double hu4;
  double local_40;
  double hu3;
  double local_30;
  double hu2;
  double local_20;
  double hu1;
  Segment *this_local;
  
  hu2._7_1_ = 1;
  hu1 = (double)this;
  local_20 = getHuMomentInvariant(this,(uint8_t *)((long)&hu2 + 7));
  hu3._7_1_ = 2;
  local_30 = getHuMomentInvariant(this,(uint8_t *)((long)&hu3 + 7));
  hu4._7_1_ = 3;
  local_40 = getHuMomentInvariant(this,(uint8_t *)((long)&hu4 + 7));
  hu5._7_1_ = 4;
  local_50 = getHuMomentInvariant(this,(uint8_t *)((long)&hu5 + 7));
  hu6._7_1_ = 5;
  local_60 = getHuMomentInvariant(this,(uint8_t *)((long)&hu6 + 7));
  hu7._7_1_ = 6;
  local_70 = getHuMomentInvariant(this,(uint8_t *)((long)&hu7 + 7));
  local_81[0] = '\a';
  dVar1 = getHuMomentInvariant(this,local_81);
  if ((local_20 < 0.29249645) || (0.62405175 < local_20)) {
    this_local._7_1_ = false;
  }
  else if ((local_30 < 0.00128345) || (0.1776243 < local_30)) {
    this_local._7_1_ = false;
  }
  else if ((local_40 < 0.015959) || (0.2128749 < local_40)) {
    this_local._7_1_ = false;
  }
  else if ((local_50 < 6.365e-05) || (0.05175975 < local_50)) {
    this_local._7_1_ = false;
  }
  else if ((local_60 < -1e-06) || (0.0051639 < local_60)) {
    this_local._7_1_ = false;
  }
  else if ((local_70 < -1e-06) || (0.018841200000000002 < local_70)) {
    this_local._7_1_ = false;
  }
  else if ((dVar1 < 0.0210235) || (0.06406785000000001 < dVar1)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

const bool
Segment::isLetterT()
const
{
    const auto hu1 = this->getHuMomentInvariant(1);
    const auto hu2 = this->getHuMomentInvariant(2);
    const auto hu3 = this->getHuMomentInvariant(3);
    const auto hu4 = this->getHuMomentInvariant(4);
    const auto hu5 = this->getHuMomentInvariant(5);
    const auto hu6 = this->getHuMomentInvariant(6);
    const auto hu7 = this->getHuMomentInvariant(7);

    if (hu1 < 0.307891 * 0.95 || hu1 > 0.594335 * 1.05) {
        return false;
    }
    if (hu2 < 0.001351 * 0.95 || hu2 > 0.169166 * 1.05) {
        return false;
    }
    if (hu3 < 0.015959 * 1 || hu3 > 0.202738 * 1.05) {
        return false;
    }
    if (hu4 < 0.000067 * 0.95 || hu4 > 0.049295 * 1.05) {
        return false;
    }
    if (hu5 < -0.000001 || hu5 > 0.004918 * 1.05) {
        return false;
    }
    if (hu6 < -0.000001 || hu6 > 0.017944 * 1.05) {
        return false;
    }
    if (hu7 < 0.02213 * 0.95 || hu7 > 0.061017 * 1.05) {
        return false;
    }

    return true;
}